

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

Uint64 Diligent::PinWorkerThread(Uint32 ThreadId,Uint64 AllowedCoresMask)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  Uint64 UVar4;
  char (*Args_1) [22];
  uint *in_R9;
  ulong uVar5;
  Uint32 bit;
  char (*in_stack_ffffffffffffff88) [17];
  string _msg;
  Uint32 WorkerCore;
  Uint32 ThreadId_local;
  ulong local_48;
  Uint64 NumCores;
  Uint64 AllowedCoresMask_local;
  
  if (AllowedCoresMask != 0) {
    ThreadId_local = ThreadId;
    AllowedCoresMask_local = AllowedCoresMask;
    uVar2 = std::thread::hardware_concurrency();
    local_48 = (ulong)uVar2;
    if (1 < uVar2) {
      uVar5 = ~(-1L << ((byte)uVar2 & 0x3f));
      if (0x3f < uVar2) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar5 = uVar5 & AllowedCoresMask;
      NumCores = local_48;
      if (uVar5 != 0) {
        uVar3 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
        Args_1 = (char (*) [22])
                 (((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        uVar3 = (ulong)ThreadId % (ulong)Args_1;
        for (uVar2 = 0; uVar1 = local_48, uVar2 < (uint)uVar3; uVar2 = uVar2 + 1) {
          if (uVar5 == 0) {
            FormatString<char[26],char[18]>
                      (&_msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"AffinityMask != 0",(char (*) [18])Args_1);
            Args_1 = (char (*) [22])0x17d;
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"PinWorkerThread",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                       ,0x17d);
            std::__cxx11::string::~string((string *)&_msg);
          }
          uVar5 = uVar5 & uVar5 - 1;
        }
        if (uVar5 == 0) {
          FormatString<char[26],char[18]>
                    (&_msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AffinityMask != 0",(char (*) [18])Args_1);
          Args_1 = (char (*) [22])0x182;
          DebugAssertionFailed
                    (_msg._M_dataplus._M_p,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x182);
          std::__cxx11::string::~string((string *)&_msg);
          uVar3 = 0x40;
        }
        else {
          uVar3 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
        }
        WorkerCore = (Uint32)uVar3;
        if (uVar1 <= uVar3) {
          FormatString<char[26],char[22]>
                    (&_msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"WorkerCore < NumCores",Args_1);
          DebugAssertionFailed
                    (_msg._M_dataplus._M_p,"PinWorkerThread",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                     ,0x184);
          std::__cxx11::string::~string((string *)&_msg);
        }
        UVar4 = LinuxMisc::SetCurrentThreadAffinity(1L << ((byte)uVar3 & 0x3f));
        if (UVar4 == 0) {
          FormatString<char[29],unsigned_int,char[10],unsigned_int>
                    (&_msg,(Diligent *)"Failed to pin worker thread ",(char (*) [29])&ThreadId_local
                     ,(uint *)" to core ",(char (*) [10])&WorkerCore,in_R9);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
          }
          std::__cxx11::string::~string((string *)&_msg);
        }
        return (ulong)(UVar4 != 0);
      }
      FormatString<char[23],std::ios_base&(std::ios_base&),unsigned_long,char[42],std::ios_base&(std::ios_base&),unsigned_long,char[17]>
                (&_msg,(Diligent *)"Allowed cores mask (0x",(char (*) [23])std::hex,
                 (_func_ios_base_ptr_ios_base_ptr *)&AllowedCoresMask_local,
                 (unsigned_long *)") does not set any bits corresponding to ",
                 (char (*) [42])std::dec,(_func_ios_base_ptr_ios_base_ptr *)&NumCores,
                 (unsigned_long *)" available cores",in_stack_ffffffffffffff88);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  return 0;
}

Assistant:

Uint64 PinWorkerThread(Uint32 ThreadId, Uint64 AllowedCoresMask)
{
    if (AllowedCoresMask == 0)
    {
        return 0;
    }

    Uint64 NumCores = std::thread::hardware_concurrency();
    if (NumCores <= 1)
        return 0;

    Uint64 AffinityMask = AllowedCoresMask;
    if (NumCores < 64)
        AffinityMask &= (Uint64{1} << NumCores) - Uint64{1};

    if (AffinityMask == 0)
    {
        LOG_WARNING_MESSAGE("Allowed cores mask (0x", std::hex, AllowedCoresMask, ") does not set any bits corresponding to ", std::dec, NumCores, " available cores");
        return 0;
    }

    const Uint32 NumAllowedCores = PlatformMisc::CountOneBits(AffinityMask);
    const Uint32 CoreBitInd      = ThreadId % NumAllowedCores;

    for (Uint32 bit = 0; bit < CoreBitInd; ++bit)
    {
        VERIFY_EXPR(AffinityMask != 0);
        Uint64 LSB = PlatformMisc::GetLSB(AffinityMask);
        AffinityMask &= ~(Uint64{1} << LSB);
    }

    VERIFY_EXPR(AffinityMask != 0);
    Uint32 WorkerCore = PlatformMisc::GetLSB(AffinityMask);
    VERIFY_EXPR(WorkerCore < NumCores);
    Uint64 PrevMask = PlatformMisc::SetCurrentThreadAffinity(Uint64{1} << WorkerCore) != 0;
    if (PrevMask == 0)
    {
        LOG_WARNING_MESSAGE("Failed to pin worker thread ", ThreadId, " to core ", WorkerCore);
    }

    return PrevMask;
}